

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef llvm::sys::path::root_directory(StringRef path,Style style)

{
  StringRef SVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  Style SVar6;
  StringRef *pSVar7;
  reference pSVar8;
  size_t __n;
  iterator pcVar9;
  const_iterator *this;
  Style in_R8D;
  StringRef path_00;
  StringRef path_01;
  bool has_drive;
  bool has_net;
  undefined1 local_120 [8];
  const_iterator e;
  const_iterator pos;
  undefined1 local_b0 [8];
  const_iterator b;
  Style style_local;
  StringRef path_local;
  size_t local_60;
  int local_c;
  ulong uVar10;
  
  path_local.Data = (char *)path.Length;
  path_00.Length._0_4_ = style;
  path_00.Data = path_local.Data;
  path_00.Length._4_4_ = 0;
  uVar10 = (ulong)style;
  b._44_4_ = style;
  begin((const_iterator *)local_b0,(path *)path.Data,path_00,in_R8D);
  memcpy(&e.S,local_b0,0x30);
  path_01.Length = uVar10;
  path_01.Data = path_local.Data;
  end((const_iterator *)local_120,(path *)path.Data,path_01);
  bVar2 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
          ::operator!=((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                        *)local_b0,(const_iterator *)local_120);
  if (bVar2) {
    pSVar7 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
             ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                           *)local_b0);
    bVar2 = false;
    if (2 < pSVar7->Length) {
      pSVar8 = const_iterator::operator*((const_iterator *)local_b0);
      cVar3 = StringRef::operator[](pSVar8,0);
      bVar4 = is_separator(cVar3,b._44_4_);
      bVar2 = false;
      if (bVar4) {
        pSVar8 = const_iterator::operator*((const_iterator *)local_b0);
        cVar3 = StringRef::operator[](pSVar8,1);
        pSVar8 = const_iterator::operator*((const_iterator *)local_b0);
        cVar5 = StringRef::operator[](pSVar8,0);
        bVar2 = cVar3 == cVar5;
      }
    }
    SVar6 = anon_unknown.dwarf_21af95::real_style(b._44_4_);
    bVar4 = false;
    if (SVar6 == windows) {
      pSVar7 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
               ::operator->((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                             *)local_b0);
      __n = strlen(":");
      bVar4 = false;
      if (__n <= pSVar7->Length) {
        pcVar9 = StringRef::end(pSVar7);
        if (__n == 0) {
          local_c = 0;
        }
        else {
          local_c = memcmp(pcVar9 + -__n,":",__n);
        }
        bVar4 = local_c == 0;
      }
    }
    if ((bVar2) || (bVar4)) {
      this = const_iterator::operator++((const_iterator *)&e.S);
      bVar4 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
              ::operator!=((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                            *)this,(const_iterator *)local_120);
      if (bVar4) {
        pSVar8 = const_iterator::operator*((const_iterator *)&e.S);
        cVar3 = StringRef::operator[](pSVar8,0);
        bVar4 = is_separator(cVar3,b._44_4_);
        if (bVar4) {
          pSVar8 = const_iterator::operator*((const_iterator *)&e.S);
          path_local.Length = (size_t)pSVar8->Data;
          local_60 = pSVar8->Length;
          goto LAB_001f0a6d;
        }
      }
    }
    if (!bVar2) {
      pSVar8 = const_iterator::operator*((const_iterator *)local_b0);
      cVar3 = StringRef::operator[](pSVar8,0);
      bVar2 = is_separator(cVar3,b._44_4_);
      if (bVar2) {
        pSVar8 = const_iterator::operator*((const_iterator *)local_b0);
        path_local.Length = (size_t)pSVar8->Data;
        local_60 = pSVar8->Length;
        goto LAB_001f0a6d;
      }
    }
  }
  memset(&path_local.Length,0,0x10);
  StringRef::StringRef((StringRef *)&path_local.Length);
LAB_001f0a6d:
  SVar1.Length = local_60;
  SVar1.Data = (char *)path_local.Length;
  return SVar1;
}

Assistant:

StringRef root_directory(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if ((has_net || has_drive) &&
        // {C:,//net}, skip to the next component.
        (++pos != e) && is_separator((*pos)[0], style)) {
      return *pos;
    }

    // POSIX style root directory.
    if (!has_net && is_separator((*b)[0], style)) {
      return *b;
    }
  }

  // No path or no root.
  return StringRef();
}